

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

void __thiscall
RigidBodyDynamics::ComputeContactImpulsesDirect
          (RigidBodyDynamics *this,Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,
          VectorNd *QDotPlus)

{
  Index *H;
  uint uVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  void *local_50 [2];
  Index *local_40;
  VectorNd *local_38;
  
  UpdateKinematicsCustom((Model *)this,(VectorNd *)model,(VectorNd *)0x0,(VectorNd *)0x0);
  H = &QDotMinus[10].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  CompositeRigidBodyAlgorithm((Model *)this,(VectorNd *)model,(MatrixNd *)H,false);
  CalcContactJacobian((Model *)this,(VectorNd *)model,(ConstraintSet *)QDotMinus,
                      (MatrixNd *)(QDotMinus + 0xe),false);
  local_40 = H;
  local_38 = Q;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_50,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_40);
  SolveContactSystemDirect
            ((MatrixNd *)H,(MatrixNd *)(QDotMinus + 0xe),(VectorNd *)local_50,
             (VectorNd *)
             &QDotMinus[9].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,QDotMinus + 0x11,QDotPlus,
             (MatrixNd *)
             &QDotMinus[0xf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,QDotMinus + 0x11,QDotMinus + 0x12,(LinearSolver *)QDotMinus);
  free(local_50[0]);
  uVar1 = *(uint *)(this + 0x48);
  if ((ulong)uVar1 != 0) {
    pdVar2 = QDotMinus[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar3 = *(long *)CS;
    uVar5 = 0;
    do {
      *(double *)(lVar3 + uVar5 * 8) = pdVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  pdVar2 = QDotMinus[7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (pdVar2 != (double *)0x0) {
    lVar3 = QDotMinus[8].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar4 = QDotMinus[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar5 = 0;
    do {
      *(double *)(lVar3 + uVar5 * 8) = pdVar4[uVar1 + (int)uVar5];
      uVar5 = uVar5 + 1;
    } while ((double *)(uVar5 & 0xffffffff) < pdVar2);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeContactImpulsesDirect (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDotMinus,
		ConstraintSet &CS,
		Math::VectorNd &QDotPlus
		) {
	// Compute H
	UpdateKinematicsCustom (model, &Q, NULL, NULL);
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	CalcContactJacobian (model, Q, CS, CS.G, false);

	SolveContactSystemDirect (CS.H, CS.G, CS.H * QDotMinus, CS.v_plus, QDotPlus, CS.impulse, CS.A, CS.b, CS.x, CS.linear_solver);

	// Copy back QDotPlus
	for (unsigned int i = 0; i < model.dof_count; i++)
		QDotPlus[i] = CS.x[i];

	// Copy back constraint impulses 
	for (unsigned int i = 0; i < CS.size(); i++) {
		CS.impulse[i] = CS.x[model.dof_count + i];
	}
}